

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O2

void __thiscall duckdb::TableRef::Serialize(TableRef *this,Serializer *serializer)

{
  optional_idx local_18;
  
  Serializer::WriteProperty<duckdb::TableReferenceType>(serializer,100,"type",&this->type);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,0x65,"alias",&this->alias);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::SampleOptions,std::default_delete<duckdb::SampleOptions>,true>>
            (serializer,0x66,"sample",&this->sample);
  local_18.index = 0xffffffffffffffff;
  Serializer::WritePropertyWithDefault<duckdb::optional_idx>
            (serializer,0x67,"query_location",&this->query_location,&local_18);
  return;
}

Assistant:

void TableRef::Serialize(Serializer &serializer) const {
	serializer.WriteProperty<TableReferenceType>(100, "type", type);
	serializer.WritePropertyWithDefault<string>(101, "alias", alias);
	serializer.WritePropertyWithDefault<unique_ptr<SampleOptions>>(102, "sample", sample);
	serializer.WritePropertyWithDefault<optional_idx>(103, "query_location", query_location, optional_idx());
}